

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug operator<<(QDebug *debug,QKeyCombination combination)

{
  QDebug *pQVar1;
  QDebug *o;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug *this;
  QDebug *in_stack_ffffffffffffff88;
  QDebug *this_00;
  Stream *debug_00;
  QDebugStateSaver *this_01;
  QDebug *t;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_c [12];
  
  local_c._4_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QDebugStateSaver *)&local_18;
  debug_00 = in_RDI;
  t = in_RSI;
  QDebugStateSaver::QDebugStateSaver(this_01,in_RSI);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff88,(char *)t);
  this_00 = &local_38;
  QDebug::QDebug(this_00,pQVar1);
  this = (QDebug *)local_c;
  QKeyCombination::keyboardModifiers((QKeyCombination *)this);
  pQVar1 = &local_30;
  operator<<<QFlags<Qt::KeyboardModifier>,_true>
            ((QDebug *)debug_00,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)this_01 >> 0x20,0));
  o = QDebug::operator<<(pQVar1,(char *)t);
  QDebug::QDebug(&local_28,o);
  QKeyCombination::key((QKeyCombination *)this);
  operator<<((QDebug *)debug_00,(Key)((ulong)this_00 >> 0x20));
  QDebug::operator<<(pQVar1,(char *)t);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug(this_00);
  QDebug::QDebug(this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_c._4_8_) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug debug, QKeyCombination combination)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QKeyCombination("
                    << combination.keyboardModifiers()
                    << ", "
                    << combination.key()
                    << ")";
    return debug;
}